

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tearing.c
# Opt level: O2

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *pGVar1;
  GLFWvidmode *pGVar2;
  int ypos;
  int xpos;
  int iVar3;
  int height;
  int refreshRate;
  
  if (action == 1) {
    switch(key) {
    case 0x100:
      glfwSetWindowShouldClose(window,1);
      return;
    case 0x102:
    case 0x103:
    case 0x104:
    case 0x105:
    case 0x106:
    case 0x107:
      break;
    case 0x108:
      if ((swap_tear != 0) || (0 < swap_interval)) {
        iVar3 = swap_interval + -1;
        goto LAB_0010a961;
      }
      break;
    case 0x109:
      iVar3 = swap_interval + 1;
LAB_0010a961:
      set_swap_interval(window,iVar3);
      return;
    default:
      if (key != 300) {
        return;
      }
    case 0x101:
      if (mods == 4) {
        pGVar1 = glfwGetWindowMonitor(window);
        if (pGVar1 == (GLFWmonitor *)0x0) {
          pGVar1 = glfwGetPrimaryMonitor();
          pGVar2 = glfwGetVideoMode(pGVar1);
          glfwGetWindowPos(window,&key_callback::x,&key_callback::y);
          glfwGetWindowSize(window,&key_callback::width,&key_callback::height);
          iVar3 = pGVar2->width;
          height = pGVar2->height;
          refreshRate = pGVar2->refreshRate;
          xpos = 0;
          ypos = 0;
        }
        else {
          refreshRate = 0;
          pGVar1 = (GLFWmonitor *)0x0;
          xpos = key_callback::x;
          ypos = key_callback::y;
          iVar3 = key_callback::width;
          height = key_callback::height;
        }
        glfwSetWindowMonitor(window,pGVar1,xpos,ypos,iVar3,height,refreshRate);
      }
    }
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_UP:
        {
            if (swap_interval + 1 > swap_interval)
                set_swap_interval(window, swap_interval + 1);
            break;
        }

        case GLFW_KEY_DOWN:
        {
            if (swap_tear)
            {
                if (swap_interval - 1 < swap_interval)
                    set_swap_interval(window, swap_interval - 1);
            }
            else
            {
                if (swap_interval - 1 >= 0)
                    set_swap_interval(window, swap_interval - 1);
            }
            break;
        }

        case GLFW_KEY_ESCAPE:
            glfwSetWindowShouldClose(window, 1);
            break;

        case GLFW_KEY_F11:
        case GLFW_KEY_ENTER:
        {
            static int x, y, width, height;

            if (mods != GLFW_MOD_ALT)
                return;

            if (glfwGetWindowMonitor(window))
                glfwSetWindowMonitor(window, NULL, x, y, width, height, 0);
            else
            {
                GLFWmonitor* monitor = glfwGetPrimaryMonitor();
                const GLFWvidmode* mode = glfwGetVideoMode(monitor);
                glfwGetWindowPos(window, &x, &y);
                glfwGetWindowSize(window, &width, &height);
                glfwSetWindowMonitor(window, monitor,
                                     0, 0, mode->width, mode->height,
                                     mode->refreshRate);
            }

            break;
        }
    }
}